

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_delete.cpp
# Opt level: O0

int main(void)

{
  __type _Var1;
  uint uVar2;
  int iVar3;
  htEntry *phVar4;
  ostream *poVar5;
  string *__lhs;
  string local_1d8;
  string local_1b8;
  ulong local_198;
  size_t i_5;
  string local_170;
  ulong local_150;
  size_t i_4;
  ulong local_128;
  size_t i_3;
  string local_100;
  ulong local_e0;
  size_t i_2;
  ulong local_b8;
  size_t i_1;
  string local_80;
  ulong local_60;
  size_t i;
  undefined1 local_50 [6];
  anon_class_1_0_00000001 changeUpdateValue;
  anon_class_1_0_00000001 changeValue;
  HotRing ht;
  
  HotRingInstance::HotRing::HotRing((HotRing *)local_50,3000);
  for (local_60 = 0; local_60 < 30000; local_60 = local_60 + 1) {
    std::__cxx11::to_string(&local_80,local_60);
    main::$_0::operator()[abi_cxx11_((string *)&i_1,(void *)((long)&i + 7),local_60);
    HotRingInstance::HotRing::insert((HotRing *)local_50,&local_80,(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    std::__cxx11::string::~string((string *)&local_80);
  }
  local_b8 = 0;
  while( true ) {
    if (14999 < local_b8) {
      local_e0 = 0;
      do {
        if (29999 < local_e0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Pass remove test.\n");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          local_128 = 30000;
          while( true ) {
            if (59999 < local_128) {
              poVar5 = std::operator<<((ostream *)&std::cout,"Pass remove out of bound test.\n");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              for (local_150 = 15000; local_150 < 30000; local_150 = local_150 + 1) {
                std::__cxx11::to_string(&local_170,local_150);
                main::$_1::operator()[abi_cxx11_((string *)&i_5,(void *)((long)&i + 6),local_150);
                HotRingInstance::HotRing::update((HotRing *)local_50,&local_170,(string *)&i_5);
                std::__cxx11::string::~string((string *)&i_5);
                std::__cxx11::string::~string((string *)&local_170);
              }
              local_198 = 15000;
              while( true ) {
                if (29999 < local_198) {
                  poVar5 = std::operator<<((ostream *)&std::cout,"Pass update test.\n");
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  HotRingInstance::HotRing::~HotRing((HotRing *)local_50);
                  return 0;
                }
                std::__cxx11::to_string(&local_1b8,local_198);
                phVar4 = HotRingInstance::HotRing::search((HotRing *)local_50,&local_1b8);
                __lhs = HotRingInstance::htEntry::get_val_abi_cxx11_(phVar4);
                main::$_1::operator()[abi_cxx11_(&local_1d8,(void *)((long)&i + 6),local_198);
                _Var1 = std::operator==(__lhs,&local_1d8);
                if (!_Var1) break;
                std::__cxx11::string::~string((string *)&local_1d8);
                std::__cxx11::string::~string((string *)&local_1b8);
                local_198 = local_198 + 1;
              }
              __assert_fail("ht.search(to_string(i))->get_val() == changeUpdateValue(i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                            ,0x32,"int main()");
            }
            std::__cxx11::to_string((string *)&i_4,local_128);
            iVar3 = HotRingInstance::HotRing::remove((HotRing *)local_50,(char *)&i_4);
            if ((((byte)iVar3 ^ 0xff) & 1) == 0) break;
            std::__cxx11::string::~string((string *)&i_4);
            local_128 = local_128 + 1;
          }
          __assert_fail("!ht.remove(to_string(i))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                        ,0x28,"int main()");
        }
        if (local_e0 < 15000) {
          std::__cxx11::to_string(&local_100,local_e0);
          phVar4 = HotRingInstance::HotRing::search((HotRing *)local_50,&local_100);
          if (phVar4 != (htEntry *)0x0) {
            __assert_fail("!ht.search(to_string(i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                          ,0x1f,"int main()");
          }
          std::__cxx11::string::~string((string *)&local_100);
        }
        else {
          std::__cxx11::to_string((string *)&i_3,local_e0);
          phVar4 = HotRingInstance::HotRing::search((HotRing *)local_50,(string *)&i_3);
          if (phVar4 == (htEntry *)0x0) {
            __assert_fail("ht.search(to_string(i))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                          ,0x21,"int main()");
          }
          std::__cxx11::string::~string((string *)&i_3);
        }
        local_e0 = local_e0 + 1;
      } while( true );
    }
    std::__cxx11::to_string((string *)&i_2,local_b8);
    uVar2 = HotRingInstance::HotRing::remove((HotRing *)local_50,(char *)&i_2);
    if ((uVar2 & 1) == 0) break;
    std::__cxx11::string::~string((string *)&i_2);
    local_b8 = local_b8 + 1;
  }
  __assert_fail("ht.remove(to_string(i))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Super-long[P]HotRing-s/update_delete.cpp"
                ,0x1a,"int main()");
}

Assistant:

int main(){
    HotRingInstance::HotRing ht(buckets);
    auto changeValue = [](size_t para) -> string {
        return to_string(para) + "a";
    };

    auto changeUpdateValue = [](size_t para) -> string {
        return to_string(para) + "aaaaa";
    };

    for (size_t i = 0; i < buckets*len; i++){ // 链平均长度为3
        ht.insert(to_string(i), changeValue(i));
    }


    for (size_t i = 0; i < buckets*len/2; i++){
        assert(ht.remove(to_string(i)));
    }

    for (size_t i = 0; i < buckets*len; i++){
        if(i < buckets*len/2){
            assert(!ht.search(to_string(i)));
        } else {
            assert(ht.search(to_string(i)));
        }
    }

    cout << "Pass remove test.\n" << endl;

    for (size_t i = buckets*len; i < buckets*len*2; i++){
        assert(!ht.remove(to_string(i)));
    }

    cout << "Pass remove out of bound test.\n" << endl;

    for (size_t i = buckets*len/2; i < buckets*len; i++){
        ht.update(to_string(i), changeUpdateValue(i));
    }

    for (size_t i = buckets*len/2; i < buckets*len; i++){
        assert(ht.search(to_string(i))->get_val() == changeUpdateValue(i));
    }

    cout << "Pass update test.\n" << endl;
    return 0;
}